

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToDisplayBehind(ImGuiWindow *window,ImGuiWindow *behind_window)

{
  ImGuiContext *pIVar1;
  int iVar2;
  int i;
  ImGuiWindow **ppIVar3;
  long in_RDI;
  size_t copy_bytes_1;
  size_t copy_bytes;
  int pos_beh;
  int pos_wnd;
  ImGuiContext *g;
  ImGuiWindow *in_stack_ffffffffffffffc0;
  ImGuiWindow *pIVar4;
  
  pIVar1 = GImGui;
  pIVar4 = *(ImGuiWindow **)(in_RDI + 0x350);
  iVar2 = FindWindowDisplayIndex(in_stack_ffffffffffffffc0);
  i = FindWindowDisplayIndex(in_stack_ffffffffffffffc0);
  if (iVar2 < i) {
    memmove((pIVar1->Windows).Data + iVar2,(pIVar1->Windows).Data + (iVar2 + 1),
            (long)((i - iVar2) + -1) << 3);
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,i + -1);
    *ppIVar3 = pIVar4;
  }
  else {
    memmove((pIVar1->Windows).Data + (i + 1),(pIVar1->Windows).Data + i,(long)(iVar2 - i) << 3);
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,i);
    *ppIVar3 = pIVar4;
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBehind(ImGuiWindow* window, ImGuiWindow* behind_window)
{
    IM_ASSERT(window != NULL && behind_window != NULL);
    ImGuiContext& g = *GImGui;
    window = window->RootWindow;
    behind_window = behind_window->RootWindow;
    int pos_wnd = FindWindowDisplayIndex(window);
    int pos_beh = FindWindowDisplayIndex(behind_window);
    if (pos_wnd < pos_beh)
    {
        size_t copy_bytes = (pos_beh - pos_wnd - 1) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_wnd], &g.Windows.Data[pos_wnd + 1], copy_bytes);
        g.Windows[pos_beh - 1] = window;
    }
    else
    {
        size_t copy_bytes = (pos_wnd - pos_beh) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_beh + 1], &g.Windows.Data[pos_beh], copy_bytes);
        g.Windows[pos_beh] = window;
    }
}